

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int link_get_name(LINK_HANDLE link,char **link_name)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  char **link_name_local;
  LINK_HANDLE link_local;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_get_name",0x610,1,"NULL link");
    }
    l._4_4_ = 0x611;
  }
  else {
    *link_name = link->name;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int link_get_name(LINK_HANDLE link, const char** link_name)
{
    int result;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else
    {
        *link_name = link->name;
        result = 0;
    }

    return result;
}